

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  char *label_00;
  char *pcVar4;
  undefined8 unaff_RBX;
  char *windows;
  ImVec2 *unaff_RBP;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *columns;
  char *pcVar8;
  ImVec2 *unaff_R14;
  char *label_01;
  bool bVar9;
  ImDrawList *unaff_retaddr;
  int n;
  ImGuiWindowFlags flags;
  bool open;
  ImGuiTreeNodeFlags tree_node_flags;
  bool is_active;
  ImGuiContext *g;
  char *in_stack_00000270;
  ImDrawList *in_stack_00000278;
  ImGuiWindow *in_stack_00000280;
  ImVec2 *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  ImVec4 *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  ImGuiCol in_stack_ffffffffffffff84;
  char *local_78;
  uint local_70;
  int local_4c;
  ImGuiContext *label_02;
  
  if (in_RDI == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",in_RSI);
  }
  else {
    bVar2 = in_RDI->WasActive & 1;
    bVar9 = in_RDI == GImGui->NavWindow;
    label_02 = GImGui;
    if (bVar2 == 0) {
      GetStyleColorVec4(1);
      PushStyleColor(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
    }
    pcVar6 = " *Inactive*";
    if (bVar2 != 0) {
      pcVar6 = "";
    }
    bVar9 = TreeNodeEx((char *)in_RSI,(ImGuiTreeNodeFlags)(ulong)bVar9,"%s \'%s\'%s",in_RSI,
                       in_RDI->Name,pcVar6);
    if (bVar2 == 0) {
      PopStyleColor((int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    }
    bVar3 = IsItemHovered((ImGuiHoveredFlags)in_stack_ffffffffffffff60);
    if ((bVar3) && (bVar2 != 0)) {
      GetForegroundDrawList((ImGuiWindow *)0x149ec2);
      operator+(in_stack_ffffffffffffff58,(ImVec2 *)0x149ee4);
      ImDrawList::AddRect(unaff_retaddr,unaff_RBP,unaff_R14,(ImU32)((ulong)unaff_RBX >> 0x20),
                          (float)unaff_RBX,(ImDrawCornerFlags)((ulong)in_RDI >> 0x20),
                          SUB84(in_RDI,0));
    }
    if (bVar9) {
      if ((in_RDI->MemoryCompacted & 1U) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar1 = in_RDI->Flags;
      DebugNodeDrawList(in_stack_00000280,in_stack_00000278,in_stack_00000270);
      BulletText((char *)(double)(in_RDI->Pos).x,(double)(in_RDI->Pos).y,(double)(in_RDI->Size).x,
                 (double)(in_RDI->Size).y,(double)(in_RDI->ContentSize).x,
                 (double)(in_RDI->ContentSize).y,(double)(in_RDI->ContentSizeIdeal).x,
                 (double)(in_RDI->ContentSizeIdeal).y,
                 "Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)");
      pcVar6 = "";
      if ((uVar1 & 0x1000000) != 0) {
        pcVar6 = "Child ";
      }
      pcVar4 = "";
      if ((uVar1 & 0x2000000) != 0) {
        pcVar4 = "Tooltip ";
      }
      pcVar5 = "";
      if ((uVar1 & 0x4000000) != 0) {
        pcVar5 = "Popup ";
      }
      pcVar7 = "";
      if ((uVar1 & 0x8000000) != 0) {
        pcVar7 = "Modal ";
      }
      label_01 = "";
      if ((uVar1 & 0x10000000) != 0) {
        label_01 = "ChildMenu ";
      }
      windows = "";
      if ((uVar1 & 0x100) != 0) {
        windows = "NoSavedSettings ";
      }
      pcVar8 = "";
      if ((uVar1 & 0x200) != 0) {
        pcVar8 = "NoMouseInputs";
      }
      columns = "";
      if ((uVar1 & 0x40000) != 0) {
        columns = "NoNavInputs";
      }
      label_00 = "";
      if ((uVar1 & 0x40) != 0) {
        label_00 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar1,pcVar6,pcVar4,pcVar5,pcVar7,
                 label_01,windows,pcVar8);
      pcVar6 = "";
      if ((in_RDI->ScrollbarX & 1U) != 0) {
        pcVar6 = "X";
      }
      pcVar4 = "";
      if ((in_RDI->ScrollbarY & 1U) != 0) {
        pcVar4 = "Y";
      }
      BulletText((char *)(double)(in_RDI->Scroll).x,(double)(in_RDI->ScrollMax).x,
                 (double)(in_RDI->Scroll).y,(double)(in_RDI->ScrollMax).y,
                 "Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",pcVar6,pcVar4);
      if (((in_RDI->Active & 1U) == 0) && ((in_RDI->WasActive & 1U) == 0)) {
        local_70 = 0xffffffff;
      }
      else {
        local_70 = (uint)in_RDI->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(in_RDI->Active & 1),(ulong)(in_RDI->WasActive & 1),
                 (ulong)(in_RDI->WriteAccessed & 1),(ulong)local_70);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(in_RDI->Appearing & 1),(ulong)(in_RDI->Hidden & 1),
                 (ulong)(uint)(int)in_RDI->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)in_RDI->HiddenFramesCannotSkipItems,
                 (ulong)(in_RDI->SkipItems & 1),label_01,windows,pcVar8);
      BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)in_RDI->NavLastIds[0],
                 (ulong)in_RDI->NavLastIds[1],(ulong)(uint)(in_RDI->DC).NavLayerActiveMask);
      if (in_RDI->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        local_78 = "NULL";
      }
      else {
        local_78 = in_RDI->NavLastChildNavWindow->Name;
      }
      BulletText("NavLastChildNavWindow: %s",local_78);
      bVar9 = ImRect::IsInverted(in_RDI->NavRectRel);
      if (bVar9) {
        BulletText("NavRectRel[0]: <None>");
      }
      else {
        BulletText((char *)(double)in_RDI->NavRectRel[0].Min.x,(double)in_RDI->NavRectRel[0].Min.y,
                   (double)in_RDI->NavRectRel[0].Max.x,(double)in_RDI->NavRectRel[0].Max.y,
                   "NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)");
      }
      if (in_RDI->RootWindow != in_RDI) {
        DebugNodeWindow(in_RSI,&label_02->Initialized);
      }
      if (in_RDI->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(in_RSI,&label_02->Initialized);
      }
      if (0 < (in_RDI->DC).ChildWindows.Size) {
        DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)windows,label_01);
      }
      if ((0 < (in_RDI->ColumnsStorage).Size) &&
         (bVar9 = TreeNode("Columns","Columns sets (%d)",(ulong)(uint)(in_RDI->ColumnsStorage).Size)
         , bVar9)) {
        for (local_4c = 0; local_4c < (in_RDI->ColumnsStorage).Size; local_4c = local_4c + 1) {
          ImVector<ImGuiOldColumns>::operator[](&in_RDI->ColumnsStorage,local_4c);
          DebugNodeColumns((ImGuiOldColumns *)columns);
        }
        TreePop();
      }
      DebugNodeStorage((ImGuiStorage *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                       ,label_00);
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
    BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (!window->NavRectRel[0].IsInverted())
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
    else
        BulletText("NavRectRel[0]: <None>");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}